

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
::split(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
        *this,int insert_position,
       btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
       *dest,allocator_type *alloc)

{
  uint uVar1;
  field_type fVar2;
  field_type fVar3;
  byte bVar4;
  bool bVar5;
  template_ElementType<1UL> *ptVar6;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  *pbVar7;
  slot_type *psVar8;
  slot_type *psVar9;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
  *c;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX;
  allocator_type *alloc_01;
  allocator_type *extraout_RDX_00;
  allocator_type *alloc_02;
  int iVar10;
  byte bVar11;
  allocator_type *in_R9;
  ulong uVar12;
  size_type i;
  ulong i_00;
  allocator_type local_40;
  allocator_type local_38;
  
  fVar2 = count(dest);
  if (fVar2 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8fb,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>]"
                 );
  }
  fVar2 = max_count(this);
  if (fVar2 == '\x0f') {
    if (insert_position == 0xf) {
      bVar11 = 0;
    }
    else if (insert_position == 0) {
      fVar2 = count(this);
      bVar11 = fVar2 - 1;
    }
    else {
      bVar11 = count(this);
      bVar11 = bVar11 >> 1;
    }
    ptVar6 = btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
             ::GetField<1ul>((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                              *)dest);
    ptVar6[2] = bVar11;
    fVar2 = count(this);
    fVar3 = count(dest);
    ptVar6 = btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
             ::GetField<1ul>((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                              *)this);
    ptVar6[2] = fVar2 - fVar3;
    fVar2 = count(this);
    if (fVar2 != '\0') {
      bVar11 = count(dest);
      bVar4 = count(this);
      alloc_00 = (allocator_type *)0x0;
      uninitialized_move_n(this,(ulong)bVar11,(ulong)bVar4,0,dest,in_R9);
      bVar11 = count(this);
      bVar4 = count(dest);
      value_destroy_n(this,(ulong)bVar11,(ulong)bVar4,alloc_00);
      fVar2 = count(this);
      ptVar6 = btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
               ::GetField<1ul>((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                                *)this);
      ptVar6[2] = fVar2 + 0xff;
      pbVar7 = parent(this);
      bVar11 = position(this);
      bVar4 = count(this);
      local_40.super_CountingAllocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>.
      bytes_used_ = (CountingAllocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>)
                    slot(this,(ulong)bVar4);
      bVar4 = count(pbVar7);
      if (bVar4 < bVar11) {
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>, Args = <phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>> *>]"
                     );
      }
      uVar12 = (ulong)bVar11;
      bVar4 = count(pbVar7);
      if (bVar11 < bVar4) {
        bVar11 = count(pbVar7);
        bVar4 = count(pbVar7);
        local_38.
        super_CountingAllocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>.
        bytes_used_ = (CountingAllocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>
                       )slot(pbVar7,(ulong)bVar4 - 1);
        btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
        ::value_init<phmap::priv::map_slot_type<std::pair<int,int>,std::pair<int,int>>*>
                  ((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                    *)pbVar7,(ulong)bVar11,&local_38,
                   (map_slot_type<std::pair<int,_int>,_std::pair<int,_int>_> **)alloc_00);
        bVar11 = count(pbVar7);
        alloc_01 = extraout_RDX;
        for (i = (ulong)bVar11 - 2; uVar12 < i + 1; i = i - 1) {
          psVar8 = slot(pbVar7,i);
          psVar9 = slot(pbVar7,i + 1);
          (psVar9->value).first.first = (psVar8->value).first.first;
          (psVar9->value).first.second = (psVar8->value).first.second;
          (psVar9->value).second.first = (psVar8->value).second.first;
          uVar1 = (psVar8->value).second.second;
          alloc_00 = (allocator_type *)(ulong)uVar1;
          (psVar9->value).second.second = uVar1;
          alloc_01 = extraout_RDX_00;
        }
        value_destroy(pbVar7,uVar12,alloc_01);
      }
      btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
      ::value_init<phmap::priv::map_slot_type<std::pair<int,int>,std::pair<int,int>>*>
                ((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                  *)pbVar7,uVar12,&local_40,
                 (map_slot_type<std::pair<int,_int>,_std::pair<int,_int>_> **)alloc_00);
      fVar2 = count(pbVar7);
      ptVar6 = btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
               ::GetField<1ul>((btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,std::less<std::pair<int,int>>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>
                                *)pbVar7);
      ptVar6[2] = fVar2 + '\x01';
      bVar5 = leaf(pbVar7);
      if (!bVar5) {
        bVar11 = count(pbVar7);
        uVar12 = uVar12 + 1;
        if (uVar12 < bVar11) {
          bVar11 = count(pbVar7);
          i_00 = (ulong)bVar11;
          while ((long)uVar12 < (long)i_00) {
            c = child(pbVar7,i_00 - 1);
            set_child(pbVar7,i_00,c);
            i_00 = i_00 - 1;
          }
          mutable_child(pbVar7,uVar12);
        }
      }
      bVar11 = count(this);
      value_destroy(this,(ulong)bVar11,alloc_02);
      pbVar7 = parent(this);
      bVar11 = position(this);
      init_child(pbVar7,bVar11 + 1,dest);
      bVar5 = leaf(this);
      if (!bVar5) {
        iVar10 = 1;
        while( true ) {
          bVar11 = count(dest);
          if ((uint)bVar11 < iVar10 - 1U) break;
          bVar11 = count(this);
          pbVar7 = child(this,(ulong)((uint)bVar11 + iVar10));
          if (pbVar7 == (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                         *)0x0) {
            __assert_fail("child(count() + i + 1) != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x91a,
                          "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>]"
                         );
          }
          bVar11 = count(this);
          pbVar7 = child(this,(ulong)((uint)bVar11 + iVar10));
          init_child(dest,iVar10 - 1U,pbVar7);
          bVar11 = count(this);
          mutable_child(this,(ulong)((uint)bVar11 + iVar10));
          iVar10 = iVar10 + 1;
        }
      }
      return;
    }
    __assert_fail("count() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x90a,
                  "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>]"
                 );
  }
  __assert_fail("max_count() == kNodeValues",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x8fc,
                "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, std::less<std::pair<int, int>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }